

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

QVariant * __thiscall
QTreeWidgetItem::childrenCheckState
          (QVariant *__return_storage_ptr__,QTreeWidgetItem *this,int column)

{
  long lVar1;
  QTreeWidgetItem **ppQVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((column < 0) || (lVar1 = (this->children).d.size, lVar1 == 0)) {
LAB_005b126e:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    ppQVar2 = (this->children).d.ptr;
    lVar7 = 0;
    bVar5 = false;
    bVar4 = false;
    do {
      plVar3 = *(long **)((long)ppQVar2 + lVar7);
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      (**(code **)(*plVar3 + 0x18))(&local_58,plVar3,column,10);
      if (CONCAT44(uStack_3c,uStack_40) < 4) {
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_005b124a:
        ::QVariant::~QVariant((QVariant *)&local_58);
        goto LAB_005b1284;
      }
      iVar6 = ::QVariant::toInt((bool *)local_58.data);
      if (iVar6 == 0) {
        bVar4 = true;
        if (bVar5) {
LAB_005b121d:
          ::QVariant::QVariant(__return_storage_ptr__,1);
          goto LAB_005b124a;
        }
      }
      else if ((iVar6 != 2) || (bVar5 = true, bVar4)) goto LAB_005b121d;
      ::QVariant::~QVariant((QVariant *)&local_58);
      lVar7 = lVar7 + 8;
    } while (lVar1 << 3 != lVar7);
    if (bVar4) {
      iVar6 = 0;
    }
    else {
      if (!bVar5) goto LAB_005b126e;
      iVar6 = 2;
    }
    ::QVariant::QVariant(__return_storage_ptr__,iVar6);
  }
LAB_005b1284:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QTreeWidgetItem::childrenCheckState(int column) const
{
    if (column < 0)
        return QVariant();
    bool checkedChildren = false;
    bool uncheckedChildren = false;
    for (const auto *child : children) {
        QVariant value = child->data(column, Qt::CheckStateRole);
        if (!value.isValid())
            return QVariant();

        switch (static_cast<Qt::CheckState>(value.toInt()))
        {
        case Qt::Unchecked:
            uncheckedChildren = true;
            break;
        case Qt::Checked:
            checkedChildren = true;
            break;
        case Qt::PartiallyChecked:
        default:
            return Qt::PartiallyChecked;
        }

        if (uncheckedChildren && checkedChildren)
            return Qt::PartiallyChecked;
    }

    if (uncheckedChildren)
        return Qt::Unchecked;
    else if (checkedChildren)
        return Qt::Checked;
    else
        return QVariant(); // value was not defined
}